

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

int fl_utf_nb_char(uchar *buf,int len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (len < 1) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar1 = fl_utf8len(buf[uVar4]);
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      iVar2 = iVar2 + 1;
      uVar3 = (int)uVar4 + iVar1;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < len);
  }
  return iVar2;
}

Assistant:

int
fl_utf_nb_char(
	const unsigned char 	*buf,
	int 			len)
{
  int i = 0;
  int nbc = 0;
  while (i < len) {
    int cl = fl_utf8len((buf+i)[0]);
    if (cl < 1) cl = 1;
    nbc++;
    i += cl;
  }
  return nbc;
}